

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall Am_Value_List::Set(Am_Value_List *this,Am_String *value,bool unique)

{
  Am_Value_List_Data *this_00;
  Am_Value store;
  Am_Value AStack_28;
  
  this_00 = (Am_Value_List_Data *)&AStack_28;
  if (this->data != (Am_Value_List_Data *)0x0 && unique) {
    Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  Am_Value::Am_Value(&AStack_28,value);
  Am_Value_List_Data::Set(this_00,&AStack_28,this->item);
  Am_Value::~Am_Value(&AStack_28);
  return;
}

Assistant:

void Am_Value_List::Set(const Am_Value &value, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  }
  data->Set(value, item);
}